

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knight.cpp
# Opt level: O1

void knight(Node *root,int row,int col,bool side)

{
  char target;
  int p;
  int q;
  bool bVar1;
  undefined4 in_register_00000014;
  long lVar2;
  int col_pos [8];
  int row_pos [8];
  int local_78 [8];
  int local_58 [8];
  undefined8 local_38;
  
  local_38 = CONCAT44(in_register_00000014,col);
  local_58[0] = row + -2;
  local_58[1] = row + -2;
  local_58[2] = row + -1;
  local_58[3] = row + -1;
  local_58[4] = row + 1;
  local_58[5] = row + 1;
  local_58[6] = row + 2;
  local_58[7] = row + 2;
  local_78[0] = col + -1;
  local_78[1] = col + 1;
  local_78[2] = col + -2;
  local_78[3] = col + 2;
  local_78[4] = col + -2;
  local_78[5] = col + 2;
  local_78[6] = col + -1;
  local_78[7] = col + 1;
  lVar2 = 0;
  do {
    p = local_58[lVar2];
    q = local_78[lVar2];
    target = (*root)->board[p][q];
    if (target != 'x') {
      bVar1 = same_side(side,target);
      if (!bVar1) {
        tree_insert(root,row,(int)local_38,p,q);
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  return;
}

Assistant:

void knight(Node& root, int row, int col, bool side){

    // Arrays store possible coordinates for a Knight
    int row_pos[8] = {row-2, row-2, row-1, row-1, row+1, row+1, row+2, row+2};
    int col_pos[8] = {col-1, col+1, col-2, col+2, col-2, col+2, col-1, col+1};

    int i, r, c;
    char target;
    for(i=0; i<8; i++){
        r = row_pos[i];
        c = col_pos[i];
        target = root->board[r][c];
        if('x' != target && !same_side(side, target))
            tree_insert(root, row, col, r, c);
    }
}